

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GdlRule.cpp
# Opt level: O0

GdlRuleItem * __thiscall
GdlRule::LhsSelectorItemAt
          (GdlRule *this,GrpLineAndFile *lnf,int irit,string *staClassOrAt,string *param_5,
          string *staAlias)

{
  bool bVar1;
  string *in_RCX;
  string *in_RDI;
  string *in_R9;
  string *in_stack_000001e8;
  string *in_stack_000001f0;
  int in_stack_000001fc;
  GrpLineAndFile *in_stack_00000200;
  GdlRule *in_stack_00000208;
  char *in_stack_fffffffffffffea8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffeb0;
  allocator *pgdlobj;
  string local_f8 [4];
  int in_stack_ffffffffffffff0c;
  GrcErrorList *in_stack_ffffffffffffff10;
  string local_d8 [32];
  string local_b8 [39];
  allocator local_91;
  string local_90 [55];
  allocator local_59;
  string local_58 [80];
  GdlRuleItem *local_8;
  
  pgdlobj = &local_59;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_58,"Cannot specify a selector in the lhs",pgdlobj);
  GrcErrorList::AddError
            (in_stack_ffffffffffffff10,in_stack_ffffffffffffff0c,(GdlObject *)pgdlobj,in_RDI);
  std::__cxx11::string::~string(local_58);
  std::allocator<char>::~allocator((allocator<char> *)&local_59);
  bVar1 = std::operator==(in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_90,"_",&local_91);
    std::__cxx11::string::string(local_b8,in_R9);
    local_8 = LhsItemAt(in_stack_00000208,in_stack_00000200,in_stack_000001fc,in_stack_000001f0,
                        in_stack_000001e8);
    std::__cxx11::string::~string(local_b8);
    std::__cxx11::string::~string(local_90);
    std::allocator<char>::~allocator((allocator<char> *)&local_91);
  }
  else {
    std::__cxx11::string::string(local_d8,in_RCX);
    std::__cxx11::string::string(local_f8,in_R9);
    local_8 = LhsItemAt(in_stack_00000208,in_stack_00000200,in_stack_000001fc,in_stack_000001f0,
                        in_stack_000001e8);
    std::__cxx11::string::~string(local_f8);
    std::__cxx11::string::~string(local_d8);
  }
  return local_8;
}

Assistant:

GdlRuleItem * GdlRule::LhsSelectorItemAt(GrpLineAndFile & lnf, int irit,
	std::string staClassOrAt, std::string /*staSel*/, std::string staAlias)
{
	g_errorList.AddError(3147, this,
		"Cannot specify a selector in the lhs");

	if (staClassOrAt == "@")
		return LhsItemAt(lnf, irit, "_", staAlias);
	else
		return LhsItemAt(lnf, irit, staClassOrAt, staAlias);
}